

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

natwm_error string_to_rgb(char *hex_string,uint32_t *result)

{
  size_t sVar1;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar3;
  char *pcStack_28;
  uint32_t rgb;
  char *endptr;
  uint32_t *result_local;
  char *hex_string_local;
  
  uVar3 = 0x104d55;
  endptr = (char *)result;
  result_local = (uint32_t *)hex_string;
  if (*hex_string == '#') {
    sVar1 = strlen(hex_string);
    if (sVar1 == 7) {
      pcStack_28 = (char *)0x0;
      uVar2 = strtoul((char *)((long)result_local + 1),&stack0xffffffffffffffd8,0x10);
      if (pcStack_28 == (char *)0x0) {
        internal_logger(natwm_logger,LEVEL_ERROR,"Found an invalid color value: \'%s\'",result_local
                        ,in_R8,in_R9,uVar3);
        hex_string_local._4_4_ = INVALID_INPUT_ERROR;
      }
      else {
        *(int *)endptr = (int)uVar2;
        hex_string_local._4_4_ = NO_ERROR;
      }
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Found a color value with an invalid length");
      hex_string_local._4_4_ = INVALID_INPUT_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Missing \'#\' in color value \'%s\'",hex_string,in_R8,
                    in_R9,0x104d55);
    hex_string_local._4_4_ = INVALID_INPUT_ERROR;
  }
  return hex_string_local._4_4_;
}

Assistant:

static enum natwm_error string_to_rgb(const char *hex_string, uint32_t *result)
{
        if (hex_string[0] != '#') {
                LOG_ERROR(natwm_logger, "Missing '#' in color value '%s'", hex_string);

                return INVALID_INPUT_ERROR;
        }

        if (strlen(hex_string) != 7) {
                LOG_ERROR(natwm_logger, "Found a color value with an invalid length");

                return INVALID_INPUT_ERROR;
        }

        char *endptr = NULL;
        // Have to ignore the '#'
        uint32_t rgb = (uint32_t)strtoul(hex_string + 1, &endptr, 16);

        if (endptr == NULL) {
                LOG_ERROR(natwm_logger, "Found an invalid color value: '%s'", hex_string);

                return INVALID_INPUT_ERROR;
        }

        *result = rgb;

        return NO_ERROR;
}